

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnElemSegmentFunctionIndex
          (BinaryReaderIR *this,Index segment_index,Index func_index)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  pointer pVVar3;
  Location local_90;
  Var local_70;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)segment_index) {
    pEVar2 = ppEVar1[segment_index];
    std::vector<wabt::Var,_std::allocator<wabt::Var>_>::emplace_back<>(&pEVar2->vars);
    pVVar3 = *(pointer *)
              ((long)&(pEVar2->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                      _M_impl + 8);
    GetLocation(&local_90,this);
    Var::Var(&local_70,func_index,&local_90);
    Var::operator=(pVVar3 + -1,&local_70);
    Var::~Var(&local_70);
    return (Result)Ok;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x3e5,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentFunctionIndex(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentFunctionIndex(Index segment_index,
                                                  Index func_index) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  segment->vars.emplace_back();
  Var* var = &segment->vars.back();
  *var = Var(func_index, GetLocation());
  return Result::Ok;
}